

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall symbols::Env::update(Env *this,string *s,Object *obj)

{
  Env *pEVar1;
  bool bVar2;
  mapped_type *ppOVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*>,_true>
  local_38;
  Env *local_30;
  Env *e;
  Object *obj_local;
  string *s_local;
  Env *this_local;
  
  local_30 = this;
  e = (Env *)obj;
  obj_local = (Object *)s;
  s_local = (string *)this;
  while( true ) {
    if (local_30 == (Env *)0x0) {
      return false;
    }
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*>_>_>
         ::find(&local_30->table,s);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*>_>_>
         ::end(&local_30->table);
    bVar2 = std::__detail::operator==(&local_38,&local_40);
    pEVar1 = e;
    if (((bVar2 ^ 0xffU) & 1) != 0) break;
    local_30 = local_30->prev;
  }
  ppOVar3 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*>_>_>
            ::operator[](&local_30->table,s);
  *ppOVar3 = (mapped_type)pEVar1;
  return true;
}

Assistant:

bool Env::update(std::string s, Object* obj)
{
    for(Env *e = this; e != nullptr; e = e->prev){
        if(  e->table.find(s) != e->table.end()){
            e->table[s] = obj;
            return true;
        }
    }
    return false;
}